

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::VerifyUtf8String
               (char *data,int size,Operation op,char *field_name)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_c1;
  LogMessage local_c0;
  string local_88;
  allocator local_51;
  undefined1 local_50 [8];
  string quoted_field_name;
  char *operation_str;
  char *field_name_local;
  Operation op_local;
  int size_local;
  char *data_local;
  
  bVar1 = IsStructurallyValidUTF8(data,size);
  if (bVar1) {
    data_local._7_1_ = true;
  }
  else {
    quoted_field_name.field_2._8_8_ = 0;
    if (op == PARSE) {
      quoted_field_name.field_2._8_8_ = (long)"table_driven_parsing" + 0xd;
    }
    else if (op == SERIALIZE) {
      quoted_field_name.field_2._8_8_ = anon_var_dwarf_32f7b8;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,"",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (field_name != (char *)0x0) {
      StringPrintf_abi_cxx11_(&local_88," \'%s\'",field_name);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    LogMessage::LogMessage
              (&local_c0,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x275);
    pLVar2 = LogMessage::operator<<(&local_c0,"String field");
    pLVar2 = LogMessage::operator<<(pLVar2,(string *)local_50);
    pLVar2 = LogMessage::operator<<(pLVar2," contains invalid ");
    pLVar2 = LogMessage::operator<<(pLVar2,"UTF-8 data when ");
    pLVar2 = LogMessage::operator<<(pLVar2,(char *)quoted_field_name.field_2._8_8_);
    pLVar2 = LogMessage::operator<<(pLVar2," a protocol ");
    pLVar2 = LogMessage::operator<<
                       (pLVar2,"buffer. Use the \'bytes\' type if you intend to send raw ");
    pLVar2 = LogMessage::operator<<(pLVar2,"bytes. ");
    LogFinisher::operator=(&local_c1,pLVar2);
    LogMessage::~LogMessage(&local_c0);
    data_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_50);
  }
  return data_local._7_1_;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data,
                                      int size,
                                      Operation op,
                                      const char* field_name) {
  if (!IsStructurallyValidUTF8(data, size)) {
    const char* operation_str = NULL;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
      // no default case: have the compiler warn if a case is not covered.
    }
    string quoted_field_name = "";
    if (field_name != NULL) {
      quoted_field_name = StringPrintf(" '%s'", field_name);
    }
    // no space below to avoid double space when the field name is missing.
    GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
               << "UTF-8 data when " << operation_str << " a protocol "
               << "buffer. Use the 'bytes' type if you intend to send raw "
               << "bytes. ";
    return false;
  }
  return true;
}